

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::applyClusters(btSoftBody *this,bool drift)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  Cluster **ppCVar7;
  Cluster *pCVar8;
  Node *pNVar9;
  Node **ppNVar10;
  Node *pNVar11;
  ulong uVar12;
  int iVar13;
  btVector3 *pbVar14;
  size_t sVar15;
  float *pfVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  btScalar *pbVar20;
  int iVar21;
  size_t size;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  btAlignedObjectArray<float> weights;
  btAlignedObjectArray<btVector3> deltas;
  btAlignedObjectArray<float> local_78;
  btAlignedObjectArray<btVector3> local_58;
  long local_38;
  
  CProfileManager::Start_Profile("ApplyClusters");
  local_58.m_ownsMemory = true;
  local_58.m_data = (btVector3 *)0x0;
  local_58.m_size = 0;
  local_58.m_capacity = 0;
  local_78.m_ownsMemory = true;
  local_78.m_data = (float *)0x0;
  local_78.m_size = 0;
  local_78.m_capacity = 0;
  uVar6 = (this->m_nodes).m_size;
  if ((-1 < (long)(int)uVar6) && (uVar6 != 0)) {
    size = (long)(int)uVar6 * 0x10;
    pbVar14 = (btVector3 *)btAlignedAllocInternal(size,0x10);
    if (0 < (long)local_58.m_size) {
      lVar17 = 0;
      do {
        puVar1 = (undefined8 *)((long)(local_58.m_data)->m_floats + lVar17);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar14->m_floats + lVar17);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar17 = lVar17 + 0x10;
      } while ((long)local_58.m_size * 0x10 != lVar17);
    }
    if ((local_58.m_data != (btVector3 *)0x0) && (local_58.m_ownsMemory == true)) {
      btAlignedFreeInternal(local_58.m_data);
    }
    local_58._4_8_ = (ulong)uVar6 << 0x20;
    local_58.m_data = pbVar14;
    if (uVar6 != 0) {
      sVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)pbVar14->m_floats + sVar15);
        *puVar1 = 0;
        puVar1[1] = 0;
        sVar15 = sVar15 + 0x10;
      } while (size != sVar15);
    }
  }
  local_58.m_ownsMemory = true;
  local_58.m_size = uVar6;
  iVar21 = (this->m_nodes).m_size;
  iVar13 = local_78.m_size;
  lVar17 = (long)local_78.m_size;
  if (local_78.m_size <= iVar21) {
    if ((local_78.m_size < iVar21) && (local_78.m_capacity < iVar21)) {
      if (iVar21 == 0) {
        pfVar16 = (float *)0x0;
      }
      else {
        pfVar16 = (float *)btAlignedAllocInternal((long)iVar21 * 4,0x10);
      }
      if (0 < (long)local_78.m_size) {
        lVar18 = 0;
        do {
          pfVar16[lVar18] = local_78.m_data[lVar18];
          lVar18 = lVar18 + 1;
        } while (local_78.m_size != lVar18);
      }
      if ((local_78.m_data != (float *)0x0) && (local_78.m_ownsMemory == true)) {
        btAlignedFreeInternal(local_78.m_data);
      }
      local_78.m_ownsMemory = true;
      local_78.m_capacity = iVar21;
      local_78.m_data = pfVar16;
    }
    if (iVar13 < iVar21) {
      memset(local_78.m_data + lVar17,0,(iVar21 - lVar17) * 4);
    }
  }
  local_78.m_size = iVar21;
  if ((drift) && (lVar17 = (long)(this->m_clusters).m_size, 0 < lVar17)) {
    ppCVar7 = (this->m_clusters).m_data;
    lVar18 = 0;
    do {
      pCVar8 = ppCVar7[lVar18];
      if (pCVar8->m_ndimpulses != 0) {
        fVar23 = 1.0 / (float)pCVar8->m_ndimpulses;
        uVar4 = *(undefined8 *)pCVar8->m_dimpulses[0].m_floats;
        uVar5 = *(undefined8 *)pCVar8->m_dimpulses[1].m_floats;
        *(ulong *)pCVar8->m_dimpulses[0].m_floats =
             CONCAT44((float)((ulong)uVar4 >> 0x20) * fVar23,(float)uVar4 * fVar23);
        pCVar8->m_dimpulses[0].m_floats[2] = pCVar8->m_dimpulses[0].m_floats[2] * fVar23;
        *(ulong *)pCVar8->m_dimpulses[1].m_floats =
             CONCAT44((float)((ulong)uVar5 >> 0x20) * fVar23,(float)uVar5 * fVar23);
        pCVar8->m_dimpulses[1].m_floats[2] = fVar23 * pCVar8->m_dimpulses[1].m_floats[2];
      }
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  lVar17 = (long)(this->m_clusters).m_size;
  if (0 < lVar17) {
    ppCVar7 = (this->m_clusters).m_data;
    uVar12 = (ulong)drift;
    local_38 = uVar12 * 0x20 + 0x118;
    pNVar9 = (this->m_nodes).m_data;
    lVar18 = 0;
    do {
      pCVar8 = ppCVar7[lVar18];
      if ((0 < (int)(pCVar8->m_lv).m_floats[(ulong)drift - 2]) &&
         (lVar22 = (long)(pCVar8->m_nodes).m_size, 0 < lVar22)) {
        fVar23 = (this->m_sst).sdt;
        fVar25 = pCVar8->m_vimpulses[uVar12 * 2].m_floats[2];
        fVar24 = pCVar8->m_vimpulses[uVar12 * 2 + 1].m_floats[0] * fVar23;
        uVar4 = *(undefined8 *)pCVar8->m_vimpulses[uVar12 * 2].m_floats;
        uVar5 = *(undefined8 *)(pCVar8->m_dimpulses[uVar12 * 2 + -1].m_floats + 1);
        fVar26 = (float)uVar5 * fVar23;
        fVar27 = (float)((ulong)uVar5 >> 0x20) * fVar23;
        pfVar16 = (pCVar8->m_masses).m_data;
        ppNVar10 = (pCVar8->m_nodes).m_data;
        lVar19 = 0;
        do {
          pNVar11 = ppNVar10[lVar19];
          fVar3 = pfVar16[lVar19];
          iVar21 = (int)((ulong)((long)pNVar11 - (long)pNVar9) >> 3) * -0x11111111;
          fVar28 = (pNVar11->m_x).m_floats[1] - (pCVar8->m_com).m_floats[1];
          fVar29 = (pNVar11->m_x).m_floats[2] - (pCVar8->m_com).m_floats[2];
          fVar30 = (pNVar11->m_x).m_floats[0] - (pCVar8->m_com).m_floats[0];
          *(ulong *)local_58.m_data[iVar21].m_floats =
               CONCAT44((float)((ulong)*(undefined8 *)local_58.m_data[iVar21].m_floats >> 0x20) +
                        fVar3 * (fVar27 * fVar30 + fVar29 * -fVar24 +
                                (float)((ulong)uVar4 >> 0x20) * fVar23),
                        (float)*(undefined8 *)local_58.m_data[iVar21].m_floats +
                        fVar3 * (fVar26 * fVar29 + fVar28 * -fVar27 + (float)uVar4 * fVar23));
          local_58.m_data[iVar21].m_floats[2] =
               (fVar28 * fVar24 + fVar30 * -fVar26 + fVar25 * fVar23) * fVar3 +
               local_58.m_data[iVar21].m_floats[2];
          local_78.m_data[iVar21] = fVar3 + local_78.m_data[iVar21];
          lVar19 = lVar19 + 1;
        } while (lVar22 != lVar19);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar17);
  }
  if (0 < (long)local_58.m_size) {
    pbVar20 = (((this->m_nodes).m_data)->m_x).m_floats + 2;
    lVar17 = 0;
    do {
      if (0.0 < *(float *)((long)local_78.m_data + lVar17)) {
        fVar25 = 1.0 / *(float *)((long)local_78.m_data + lVar17);
        fVar23 = (local_58.m_data)->m_floats[lVar17 + 2];
        *(ulong *)((btVector3 *)(pbVar20 + -2))->m_floats =
             CONCAT44((float)((ulong)*(undefined8 *)((btVector3 *)(pbVar20 + -2))->m_floats >> 0x20)
                      + fVar25 * (float)((ulong)*(undefined8 *)
                                                 ((local_58.m_data)->m_floats + lVar17) >> 0x20),
                      (float)*(undefined8 *)((btVector3 *)(pbVar20 + -2))->m_floats +
                      fVar25 * (float)*(undefined8 *)((local_58.m_data)->m_floats + lVar17));
        *pbVar20 = fVar23 * fVar25 + *pbVar20;
      }
      lVar17 = lVar17 + 4;
      pbVar20 = pbVar20 + 0x1e;
    } while ((long)local_58.m_size * 4 != lVar17);
  }
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_78);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_58);
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void					btSoftBody::applyClusters(bool drift)
{
	BT_PROFILE("ApplyClusters");
//	const btScalar					f0=m_sst.sdt;
	//const btScalar					f1=f0/2;
	btAlignedObjectArray<btVector3> deltas;
	btAlignedObjectArray<btScalar> weights;
	deltas.resize(m_nodes.size(),btVector3(0,0,0));
	weights.resize(m_nodes.size(),0);
	int i;

	if(drift)
	{
		for(i=0;i<m_clusters.size();++i)
		{
			Cluster&	c=*m_clusters[i];
			if(c.m_ndimpulses)
			{
				c.m_dimpulses[0]/=(btScalar)c.m_ndimpulses;
				c.m_dimpulses[1]/=(btScalar)c.m_ndimpulses;
			}
		}
	}
	
	for(i=0;i<m_clusters.size();++i)
	{
		Cluster&	c=*m_clusters[i];	
		if(0<(drift?c.m_ndimpulses:c.m_nvimpulses))
		{
			const btVector3		v=(drift?c.m_dimpulses[0]:c.m_vimpulses[0])*m_sst.sdt;
			const btVector3		w=(drift?c.m_dimpulses[1]:c.m_vimpulses[1])*m_sst.sdt;
			for(int j=0;j<c.m_nodes.size();++j)
			{
				const int			idx=int(c.m_nodes[j]-&m_nodes[0]);
				const btVector3&	x=c.m_nodes[j]->m_x;
				const btScalar		q=c.m_masses[j];
				deltas[idx]		+=	(v+btCross(w,x-c.m_com))*q;
				weights[idx]	+=	q;
			}
		}
	}
	for(i=0;i<deltas.size();++i)
	{
		if(weights[i]>0) 
		{
			m_nodes[i].m_x+=deltas[i]/weights[i];
		}
	}
}